

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O1

void retro_set_environment(retro_environment_t cb)

{
  _Bool _Var1;
  _Bool no_rom;
  retro_log_callback logging;
  retro_variable variables [3];
  undefined1 local_41;
  retro_log_printf_t local_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  char *pcStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_40 = (retro_log_printf_t)0x0;
  env_cb = cb;
  _Var1 = (*cb)(0x1b,&local_40);
  log_cb = local_40;
  if (!_Var1) {
    log_cb = fallback_log;
  }
  gb_log_set_handler(log_handler);
  local_41 = 1;
  (*env_cb)(0x12,&local_41);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = "gb_bootrom_skip";
  pcStack_20 = "Skip BootROM; false|true";
  local_38 = "gb_color";
  pcStack_30 = "Screen coloring; Gray|Green";
  (*env_cb)(0x10,&local_38);
  return;
}

Assistant:

void retro_set_environment(retro_environment_t cb)
{
   env_cb = cb;

   struct retro_log_callback logging = {0};
   if(env_cb(RETRO_ENVIRONMENT_GET_LOG_INTERFACE, &logging))
      log_cb = logging.log;
   else
      log_cb = fallback_log;

   gb_log_set_handler(log_handler);

   bool no_rom = true;
   env_cb(RETRO_ENVIRONMENT_SET_SUPPORT_NO_GAME, &no_rom);

   /// Definition of core variables (aka "Core Options")

   struct retro_variable variables[] =
   {
      { "gb_color", "Screen coloring; Gray|Green" },
      { "gb_bootrom_skip", "Skip BootROM; false|true" },
      { NULL, NULL }
   };

   env_cb(RETRO_ENVIRONMENT_SET_VARIABLES, variables);
}